

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

int NULLC::StrEqual(NULLCArray a,NULLCArray b)

{
  uint local_48;
  uint i;
  NULLCArray b_local;
  NULLCArray a_local;
  
  if (a.len == b.len) {
    for (local_48 = 0; local_48 < a.len; local_48 = local_48 + 1) {
      if (a.ptr[local_48] != b.ptr[local_48]) {
        return 0;
      }
    }
    a_local.ptr._4_4_ = 1;
  }
  else {
    a_local.ptr._4_4_ = 0;
  }
  return a_local.ptr._4_4_;
}

Assistant:

int NULLC::StrEqual(NULLCArray a, NULLCArray b)
{
	if(a.len != b.len)
		return 0;
	for(unsigned int i = 0; i < a.len; i++)
		if(a.ptr[i] != b.ptr[i])
			return 0;
	return 1;
}